

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O3

int one_hit_new(CHAR_DATA *ch,CHAR_DATA *victim,int dt,bool specials,bool blockable,int addition,
               int multiplier,char *dnoun)

{
  uint uVar1;
  OBJ_DATA *pOVar2;
  bool bVar3;
  short sVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  CClass *pCVar8;
  AFFECT_DATA *pAVar9;
  OBJ_AFFECT_DATA *pOVar10;
  short sVar11;
  int iVar12;
  uint uVar13;
  short *psVar14;
  float local_c4;
  float local_c0;
  int local_bc;
  OBJ_DATA *local_b8;
  undefined4 local_b0;
  int local_ac;
  ulong local_a8;
  int local_9c;
  AFFECT_DATA af;
  
  if (victim == (CHAR_DATA *)0x0) {
    return 0;
  }
  if (ch == (CHAR_DATA *)0x0) {
    return 0;
  }
  if (victim == ch) {
    return 0;
  }
  if (victim->position == 0) {
    return 0;
  }
  if ((ch->in_room != victim->in_room) && (gsn_hurl != dt)) {
    return 0;
  }
  local_bc = dt;
  bVar3 = is_safe_new(ch,victim,true);
  if (bVar3) {
    return 0;
  }
  iVar5 = dt;
  if (dt == -3) {
    local_bc = -1;
    iVar5 = -1;
  }
  local_b8 = get_eq_char(ch,0x10);
  iVar12 = (int)gsn_dual_wield;
  if (iVar5 == iVar12) {
    local_b8 = get_eq_char(ch,0x12);
    iVar12 = (int)gsn_dual_wield;
  }
  if ((iVar5 == -1) || (iVar5 == iVar12)) {
    if ((local_b8 == (OBJ_DATA *)0x0) || (local_b8->item_type != 5)) {
      iVar5 = ch->dam_type + 1000;
      local_bc = iVar5;
      goto LAB_0028c803;
    }
    iVar6 = local_b8->value[3];
    iVar5 = iVar6 + 1000;
    local_bc = iVar5;
LAB_0028c80e:
    lVar7 = (long)iVar6;
    local_b0 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar12 >> 8),1);
  }
  else {
LAB_0028c803:
    if (local_b8 != (OBJ_DATA *)0x0) {
      iVar6 = local_b8->value[3];
      goto LAB_0028c80e;
    }
    lVar7 = (long)ch->dam_type;
    local_b0 = 0;
  }
  local_ac = 1;
  if (attack_table.super__Vector_base<attack_type,_std::allocator<attack_type>_>._M_impl.
      super__Vector_impl_data._M_start[lVar7].damage != -1) {
    local_ac = attack_table.super__Vector_base<attack_type,_std::allocator<attack_type>_>._M_impl.
               super__Vector_impl_data._M_start[lVar7].damage;
  }
  local_9c = iVar5;
  iVar5 = get_weapon_sn_new(ch,iVar5);
  iVar12 = get_weapon_skill(ch,iVar5);
  if (dt == -3) {
    local_ac = 0x13;
  }
  local_a8 = (ulong)(iVar12 + 0x14);
  bVar3 = is_npc(ch);
  if (local_b8 == (OBJ_DATA *)0x0 && bVar3) {
    iVar5 = dice((int)ch->damage[0],(int)ch->damage[1]);
LAB_0028c98a:
    local_c4 = (float)iVar5;
  }
  else {
    if (iVar5 != -1) {
      check_improve(ch,iVar5,true,5);
    }
    pOVar2 = local_b8;
    if ((byte)local_b0 == '\0') {
      iVar5 = number_range((int)local_a8 / 0x19 + 1,(((ch->level * 2) / 3) * (int)local_a8) / 100);
      goto LAB_0028c98a;
    }
    iVar5 = dice(local_b8->value[1],local_b8->value[2]);
    local_c4 = (float)((iVar5 * (int)local_a8) / 100);
    iVar5 = (int)pOVar2->level - (int)ch->level;
    if (iVar5 < 0x23) {
      if (0x18 < iVar5) {
        local_c4 = local_c4 * 7.0;
        goto LAB_0028d0cc;
      }
      if (0xe < iVar5) {
        local_c4 = local_c4 * 8.0;
        goto LAB_0028d0cc;
      }
      if (4 < iVar5) {
        local_c4 = local_c4 * 9.0;
        goto LAB_0028d0cc;
      }
    }
    else {
      local_c4 = local_c4 * 6.0;
LAB_0028d0cc:
      local_c4 = local_c4 / 10.0;
      local_c0 = local_c4;
    }
    bVar3 = is_weapon_stat(pOVar2,3);
    if (bVar3) {
      iVar6 = number_percent();
      iVar5 = (int)local_a8;
      iVar12 = iVar5 + 7;
      if (-1 < iVar5) {
        iVar12 = iVar5;
      }
      if (iVar6 <= iVar12 >> 3) {
        local_c4 = local_c4 * 1.2;
      }
    }
  }
  iVar5 = get_skill(ch,(int)gsn_enhanced_damage);
  if (iVar5 < 1) {
    local_c4 = local_c4 * 0.7;
    local_c0 = local_c4;
  }
  else {
    iVar5 = number_percent();
    iVar12 = get_skill(ch,(int)gsn_enhanced_damage);
    if (iVar5 <= iVar12) {
      check_improve(ch,(int)gsn_enhanced_damage,true,6);
      iVar5 = number_percent();
      local_c4 = local_c4 * (float)(iVar5 / 200 + 3) * 0.5;
    }
    pCVar8 = ch->my_class;
    if ((pCVar8 == (CClass *)0x0) &&
       ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (pCVar8 = ch->pIndexData->my_class, pCVar8 == (CClass *)0x0)))) {
      pCVar8 = CClass::GetClass(0);
    }
    bVar3 = RString::operator==(&pCVar8->name,"thief");
    if (bVar3) {
      local_c4 = local_c4 * 0.75;
      local_c0 = local_c4;
    }
    iVar5 = get_skill(ch,(int)gsn_brutality);
    if ((0 < iVar5) && (bVar3 = is_npc(ch), !bVar3)) {
      iVar5 = number_percent();
      iVar12 = get_skill(ch,(int)gsn_brutality);
      if (iVar5 < iVar12) {
        bVar3 = style_check((int)gsn_brutality,(int)ch->pcdata->style);
        if ((bVar3 & (byte)local_b0) == 1) {
          if (0xe < local_b8->weight) {
            check_improve(ch,(int)gsn_brutality,true,5);
            local_c4 = local_c4 * 5.0 * 0.25;
          }
          affect_find(ch->affected,(int)gsn_hardenfist);
          goto LAB_0028cbda;
        }
      }
    }
  }
  pAVar9 = affect_find(ch->affected,(int)gsn_hardenfist);
  if (((local_b8 == (OBJ_DATA *)0x0) &&
      (bVar3 = is_affected(ch,(int)gsn_hardenfist), pAVar9 != (AFFECT_DATA *)0x0)) && (bVar3)) {
    sVar4 = pAVar9->level;
    sVar11 = sVar4 + 3;
    if (-1 < sVar4) {
      sVar11 = sVar4;
    }
    iVar5 = dice((int)sVar11 >> 2,4);
    local_c4 = (float)(((iVar5 + 10) * (int)local_a8) / 100);
  }
LAB_0028cbda:
  sVar4 = get_damroll(ch);
  iVar5 = 100;
  if ((int)local_a8 < 100) {
    iVar5 = (int)local_a8;
  }
  local_c4 = (float)((iVar5 * sVar4) / 100) + local_c4;
  local_c0 = local_c4;
  bVar3 = is_npc(ch);
  if (!bVar3) {
    local_c4 = local_c4 * pc_race_table[ch->race].racialDam;
    local_c0 = local_c4;
  }
  bVar3 = is_npc(ch);
  pOVar2 = local_b8;
  if (((!bVar3) && (bVar3 = is_affected(ch,(int)gsn_rage), bVar3)) &&
     ((ch->pcdata->tribe == 1 && (iVar5 = number_percent(), iVar5 < 10)))) {
    send_to_char("The fury of the Boar enrages you as you deliver a mighty blow!\n\r",ch);
    act("$n gets an enraged look in $s eyes and delivers a mighty blow!",ch,(void *)0x0,(void *)0x0,
        0);
    local_c4 = local_c4 * (float)((int)ch->level / 0x14);
    local_c0 = local_c4;
  }
  if (local_c4 <= 0.0) {
    local_c0 = 1.0;
  }
  bVar3 = is_npc(ch);
  iVar5 = local_9c;
  if (((pOVar2 == (OBJ_DATA *)0x0) && (!bVar3)) &&
     ((999 < local_9c || (local_9c == gsn_dual_wield)))) {
    local_bc = 0x3f9;
    iVar5 = 0x3f9;
  }
  if ((byte)local_b0 != '\0') {
    pCVar8 = ch->my_class;
    if ((pCVar8 == (CClass *)0x0) &&
       ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (pCVar8 = ch->pIndexData->my_class, pCVar8 == (CClass *)0x0)))) {
      pCVar8 = CClass::GetClass(0);
    }
    iVar12 = CClass::GetIndex(pCVar8);
    pOVar2 = local_b8;
    if ((((iVar12 == 4) && (ch->fighting != (CHAR_DATA *)0x0)) && (999 < iVar5)) &&
       (iVar5 = check_arms(ch,local_b8,false), 0 < iVar5)) {
      local_bc = iVar5 + 1000;
    }
    if ((((pOVar2->pIndexData->spec_prog).trapvector & 0x2000) != 0) &&
       (iVar5 = (*(pOVar2->pIndexData->spec_prog).func)
                          (0x2000,ch,victim,local_b8,&local_c0,&local_bc,&local_ac), 0 < iVar5)) {
      return 0;
    }
  }
  bVar3 = is_npc(victim);
  if (((bVar3) && ((victim->act[0] & 1) != 0)) &&
     ((((victim->pIndexData->spec_prog).trapvector & 0x2000) != 0 &&
      (iVar5 = (*(victim->pIndexData->spec_prog).func)
                         (0x2000,ch,victim,local_b8,&local_c0,&local_bc,&local_ac), 0 < iVar5)))) {
    return 0;
  }
  iVar12 = damage_new(ch,victim,(int)local_c0,local_bc,local_ac,true,blockable,addition,multiplier,
                      dnoun);
  iVar5 = iVar12;
  if ((char)local_b0 == '\x01' && iVar12 != -1) {
    if ((local_b8->progtypes[0] & 0x40000) != 0) {
      (*local_b8->pIndexData->iprogs->hit_prog)(local_b8,ch,victim,iVar12);
    }
    pOVar2 = local_b8;
    iVar5 = 0;
    if (((iVar12 != 0) && (iVar5 = iVar12, ch->fighting == victim)) &&
       (bVar3 = is_weapon_stat(local_b8,7), bVar3)) {
      pOVar10 = affect_find_obj(pOVar2->affected,(int)gsn_poison);
      psVar14 = &pOVar10->level;
      if (pOVar10 == (OBJ_AFFECT_DATA *)0x0) {
        psVar14 = &pOVar2->level;
      }
      sVar4 = *psVar14;
      bVar3 = saves_spell((int)(short)(sVar4 - (sVar4 >> 0xf)) >> 1,victim,8);
      if ((!bVar3) && (bVar3 = is_affected_by(victim,0xc), !bVar3)) {
        send_to_char("You feel poison coursing through your veins.\n\r",victim);
        act("$n is poisoned by the venom on $p.",victim,local_b8,(void *)0x0,0);
        init_affect(&af);
        af.where = 0;
        af.aftype = 0;
        af.type = gsn_poison;
        uVar1 = sVar4 * 3;
        uVar13 = sVar4 * 3 + 3;
        if (-1 < (int)uVar1) {
          uVar13 = uVar1;
        }
        af.level = (short)(uVar13 >> 2);
        af.duration = sVar4 / 10;
        af.location = 1;
        af.modifier = -3;
        af.bitvector[0]._1_1_ = af.bitvector[0]._1_1_ | 0x10;
        affect_join(victim,&af);
      }
      if (pOVar10 != (OBJ_AFFECT_DATA *)0x0) {
        sVar4 = 2;
        if (2 < pOVar10->level) {
          sVar4 = pOVar10->level;
        }
        sVar11 = 1;
        if (1 < pOVar10->duration) {
          sVar11 = pOVar10->duration;
        }
        pOVar10->level = sVar4 + -2;
        pOVar10->duration = sVar11 + -1;
        if ((short)(sVar11 + -1) == 0 || (short)(sVar4 + -2) == 0) {
          act("The poison on $p has worn off.",ch,local_b8,(void *)0x0,3);
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int one_hit_new(CHAR_DATA *ch, CHAR_DATA *victim, int dt, bool specials, bool blockable, int addition, int multiplier, char *dnoun)
{
	OBJ_DATA *wield = nullptr, *dualw = nullptr;
	AFFECT_DATA *af;
	int mdam, diceroll, diceroll2 = 0, sn, skill, dam_type, tmp_dt, result, rdt;
	float dam;
	bool truestrike = false;

	if (victim == ch
		|| ch == nullptr
		|| victim == nullptr
		|| victim->position == POS_DEAD
		|| (ch->in_room != victim->in_room && dt != gsn_hurl) || is_safe(ch, victim))
	{
		return 0;
	}

	if (dt == TYPE_TRUESTRIKE)
	{
		truestrike = true;
		dt = TYPE_UNDEFINED;
	}

	wield = get_eq_char(ch, WEAR_WIELD);

	if (dt == gsn_dual_wield)
		wield = get_eq_char(ch, WEAR_DUAL_WIELD);

	if (dt == TYPE_UNDEFINED || dt == gsn_dual_wield)
	{
		dt = TYPE_HIT;

		if (wield != nullptr && wield->item_type == ITEM_WEAPON)
			dt += wield->value[3];
		else
			dt += ch->dam_type;
	}

	if (wield != nullptr)
		dam_type = attack_table[wield->value[3]].damage;
	else
		dam_type = attack_table[ch->dam_type].damage;

	if (dam_type == -1)
		dam_type = DAM_BASH;

	sn = get_weapon_sn_new(ch, dt);
	skill = 20 + get_weapon_skill(ch, sn);

	if (truestrike)
		dam_type = DAM_TRUESTRIKE;

	if (is_npc(ch) && wield == nullptr)
	{
		dam = dice(ch->damage[DICE_NUMBER], ch->damage[DICE_TYPE]);
	}
	else
	{
		if (sn != -1)
			check_improve(ch, sn, true, 5);

		if (wield != nullptr)
		{
			dam = dice(wield->value[1], wield->value[2]) * skill / 100;

			if (wield->level - ch->level >= 35)
				dam = (dam * 6) / 10;
			else if (wield->level - ch->level >= 25)
				dam = (dam * 7) / 10;
			else if (wield->level - ch->level >= 15)
				dam = (dam * 8) / 10;
			else if (wield->level - ch->level >= 5)
				dam = (dam * 9) / 10;

			if (is_weapon_stat(wield, WEAPON_SHARP))
			{
				if (number_percent() <= (skill / 8))
					dam *= 1.2;
			}
		}
		else
		{
			dam = number_range(1 + 4 * skill / 100, 2 * ch->level / 3 * skill / 100);
		}
	}

	if (get_skill(ch, gsn_enhanced_damage) > 0)
	{
		if (number_percent() <= get_skill(ch, gsn_enhanced_damage))
		{
			check_improve(ch, gsn_enhanced_damage, true, 6);
			dam *= 3 + (number_percent() / 200);
			dam /= 2;
		}

		if (ch->Class()->name == "thief")
			dam *= 0.75;

		if (get_skill(ch, gsn_brutality) > 0
			&& !is_npc(ch)
			&& number_percent() < get_skill(ch, gsn_brutality)
			&& style_check(gsn_brutality, ch->pcdata->style)
			&& (wield != nullptr && wield->weight >= 15))
		{
			check_improve(ch, gsn_brutality, true, 5);
			dam *= 5;
			dam /= 4;
		}
	}
	else
	{
		dam *= (float).7;
	}

	af = affect_find(ch->affected, gsn_hardenfist);

	if (wield == nullptr && is_affected(ch, gsn_hardenfist) && af)
		dam = (dice((af->level / 4), 4) + 10) * skill / 100;

	mdam = get_damroll(ch);
	dam += mdam * std::min(100, skill) / 100;

	if (!is_npc(ch))
		dam *= pc_race_table[ch->race].racialDam;

	if (!is_npc(ch) && is_affected(ch, gsn_rage) && ch->pcdata->tribe == TRIBE_BOAR && number_percent() < 10)
	{
		send_to_char("The fury of the Boar enrages you as you deliver a mighty blow!\n\r", ch);
		act("$n gets an enraged look in $s eyes and delivers a mighty blow!", ch, 0, 0, TO_ROOM);
		dam *= ch->level / 20;
	}

	if (dam <= 0)
		dam = 1;

	if (!is_npc(ch) && wield == nullptr && (dt >= TYPE_HIT || dt == gsn_dual_wield))
		dt = TYPE_HIT + 17; // hth = #17

	if (wield
		&& ch->Class()->GetIndex() == CLASS_PALADIN
		&& ch->fighting
		&& dt >= TYPE_HIT
		&& (rdt = check_arms(ch, wield, false)) > 0) // check_arms returns 0 if normal
	{
		dt = rdt + TYPE_HIT;
	}

	if (wield && TRAPS_IEVENT(wield, TRAP_IONEHIT))
	{
		if (CALL_IEVENT(wield, TRAP_IONEHIT, ch, victim, wield, &dam, &dt, &dam_type) > 0)
			return 0;
	}

	// mob onehit [mhit] fires when mob is hit, but item onehit fires when item does the hitting

	if (is_npc(victim) && TRAPS_MEVENT(victim, TRAP_MONEHIT))
	{
		if (CALL_IEVENT(victim, TRAP_MONEHIT, ch, victim, wield, &dam, &dt, &dam_type) > 0)
			return 0;
	}

	result = damage_new(ch, victim, (int)dam, dt, dam_type, true, blockable, addition, multiplier, dnoun);

	if (result == -1) // death
		return -1;

	if (wield && IS_SET(wield->progtypes, IPROG_HIT))
		(wield->pIndexData->iprogs->hit_prog)(wield, ch, victim, result);

	if (result && wield != nullptr)
	{
		if (ch->fighting == victim && is_weapon_stat(wield, WEAPON_POISON))
		{
			int level = 10;
			OBJ_AFFECT_DATA *poison;
			AFFECT_DATA af;

			poison = affect_find_obj(wield->affected, gsn_poison);

			if (poison == nullptr)
				level = wield->level;
			else
				level = poison->level;

			if (!saves_spell(level / 2, victim, DAM_POISON) && !is_affected_by(victim, AFF_POISON))
			{
				send_to_char("You feel poison coursing through your veins.\n\r", victim);
				act("$n is poisoned by the venom on $p.", victim, wield, nullptr, TO_ROOM);
				init_affect(&af);
				af.where = TO_AFFECTS;
				af.aftype = AFT_SPELL;
				af.type = gsn_poison;
				af.level = level * 3 / 4;
				af.duration = level / 10;
				af.location = APPLY_STR;
				af.modifier = -3;
				SET_BIT(af.bitvector, AFF_POISON);
				affect_join(victim, &af);
			}

			if (poison != nullptr)
			{
				poison->level = std::max(0, poison->level - 2);
				poison->duration = std::max(0, poison->duration - 1);

				if (poison->level == 0 || poison->duration == 0)
					act("The poison on $p has worn off.", ch, wield, nullptr, TO_CHAR);
			}
		}
	}

	return result;
}